

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O3

int store_attrs(ly_ctx *ctx,attr_cont *attrs,lyd_node *first,int options)

{
  attr_cont *__ptr;
  attr_cont *paVar1;
  int iVar2;
  lyd_attr *plVar3;
  attr_cont *paVar4;
  lyd_node *parent;
  uint uVar5;
  
  if (attrs == (attr_cont *)0x0) {
    return 0;
  }
  uVar5 = 0;
  paVar4 = attrs;
LAB_0013d63b:
  __ptr = paVar4->next;
  paVar1 = attrs;
  if (first != (lyd_node *)0x0) {
    if (paVar4->index != 0) {
      uVar5 = 1;
    }
    parent = first;
    do {
      if (paVar4->schema == parent->schema) {
        if ((uVar5 == 0) || (uVar5 == paVar4->index)) goto LAB_0013d679;
        uVar5 = uVar5 + 1;
      }
      parent = parent->next;
      paVar1 = paVar4;
      if (parent == (lyd_node *)0x0) break;
    } while( true );
  }
  paVar4 = paVar1;
  ly_vlog(LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"element for the specified attribute",
          paVar4->attr->name);
  lyd_free_attr(paVar4->schema->module->ctx,(lyd_node *)0x0,paVar4->attr,1);
  goto LAB_0013d721;
LAB_0013d679:
  if (parent->attr != (lyd_attr *)0x0) {
    ly_vlog(LYE_XML_INVAL,LY_VLOG_LYD,parent,
            "attribute (multiple attribute definitions belong to a single element)");
LAB_0013d721:
    free(paVar4);
joined_r0x0013d732:
    while (__ptr != (attr_cont *)0x0) {
      paVar4 = __ptr->next;
      lyd_free_attr(ctx,(lyd_node *)0x0,__ptr->attr,1);
      free(__ptr);
      __ptr = paVar4;
    }
    return -1;
  }
  plVar3 = paVar4->attr;
  parent->attr = plVar3;
  for (; plVar3 != (lyd_attr *)0x0; plVar3 = plVar3->next) {
    plVar3->parent = parent;
  }
  free(paVar4);
  if (((options & 8U) != 0) &&
     (iVar2 = lyp_check_edit_attr(ctx,parent->attr,parent,(int *)0x0), iVar2 != 0))
  goto joined_r0x0013d732;
  paVar4 = __ptr;
  if (__ptr == (attr_cont *)0x0) {
    return 0;
  }
  goto LAB_0013d63b;
}

Assistant:

static int
store_attrs(struct ly_ctx *ctx, struct attr_cont *attrs, struct lyd_node *first, int options)
{
    struct lyd_node *diter;
    struct attr_cont *iter;
    struct lyd_attr *aiter;
    unsigned int flag_leaflist = 0;

    while (attrs) {
        iter = attrs;
        attrs = attrs->next;

        if (iter->index) {
            flag_leaflist = 1;
        }

        LY_TREE_FOR(first, diter) {
            if (iter->schema != diter->schema) {
                continue;
            }

            if (flag_leaflist && flag_leaflist != iter->index) {
                flag_leaflist++;
                continue;
            }

            /* we have match */
            if (diter->attr) {
                LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, diter,
                       "attribute (multiple attribute definitions belong to a single element)");
                free(iter);
                goto error;
            }

            diter->attr = iter->attr;
            for (aiter = iter->attr; aiter; aiter = aiter->next) {
                aiter->parent = diter;
            }

            break;
        }

        if (!diter) {
            LOGVAL(LYE_XML_MISS, LY_VLOG_NONE, NULL, "element for the specified attribute", iter->attr->name);
            lyd_free_attr(iter->schema->module->ctx, NULL, iter->attr, 1);
            free(iter);
            goto error;
        }
        free(iter);

        /* check edit-config attribute correctness */
        if ((options & LYD_OPT_EDIT) && lyp_check_edit_attr(ctx, diter->attr, diter, NULL)) {
            goto error;
        }
    }

    return 0;

error:

    while (attrs) {
        iter = attrs;
        attrs = attrs->next;

        lyd_free_attr(ctx, NULL, iter->attr, 1);
        free(iter);
    }

    return -1;
}